

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.h
# Opt level: O2

AffixMatcherWarehouse * __thiscall
icu_63::numparse::impl::AffixMatcherWarehouse::operator=
          (AffixMatcherWarehouse *this,AffixMatcherWarehouse *param_1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  
  for (lVar4 = 8; lVar4 != 0x128; lVar4 = lVar4 + 0x20) {
    *(undefined4 *)((long)&this->fAffixMatchers[0].fSuffix + lVar4) =
         *(undefined4 *)((long)&param_1->fAffixMatchers[0].fSuffix + lVar4);
    puVar1 = (undefined8 *)
             ((long)&param_1->fAffixMatchers[0].super_NumberParseMatcher._vptr_NumberParseMatcher +
             lVar4);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)
             ((long)&this->fAffixMatchers[0].super_NumberParseMatcher._vptr_NumberParseMatcher +
             lVar4);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
  }
  for (lVar4 = 0x120; lVar4 != 0x300; lVar4 = lVar4 + 0x50) {
    AffixPatternMatcher::operator=
              ((AffixPatternMatcher *)
               ((long)&this->fAffixMatchers[0].super_NumberParseMatcher._vptr_NumberParseMatcher +
               lVar4),(AffixPatternMatcher *)
                      ((long)&param_1->fAffixMatchers[0].super_NumberParseMatcher.
                              _vptr_NumberParseMatcher + lVar4));
  }
  this->fTokenWarehouse = param_1->fTokenWarehouse;
  return this;
}

Assistant:

AffixMatcherWarehouse() = default;